

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::addImageProcessingQCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  pointer ppIVar1;
  Instruction *pIVar2;
  iterator __position;
  bool bVar3;
  undefined8 in_RAX;
  vector<spv::Decoration,std::allocator<spv::Decoration>> *this_00;
  ulong uVar4;
  Op OVar5;
  Id texid;
  Decoration local_18;
  key_type local_14;
  
  uVar4 = (ulong)id;
  local_14 = (key_type)((ulong)in_RAX >> 0x20);
  _local_18 = CONCAT44(local_14,decor);
  ppIVar1 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar2 = ppIVar1[id];
  OVar5 = pIVar2->opCode;
  if (OVar5 == OpSampledImage) {
    if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) == 0) goto LAB_00451e52;
    uVar4 = (ulong)*(pIVar2->operands).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
    OVar5 = ppIVar1[uVar4]->opCode;
  }
  if (OVar5 == OpLoad) {
    if ((**(byte **)&(ppIVar1[uVar4]->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) == 0) {
LAB_00451e52:
      __assert_fail("idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
    }
    local_14 = *(ppIVar1[uVar4]->operands).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_18 = decor;
    bVar3 = hasQCOMImageProceessingDecoration(this,local_14,decor);
    if (!bVar3) {
      spv::Builder::addDecoration(&this->builder,local_14,local_18,-1);
      this_00 = (vector<spv::Decoration,std::allocator<spv::Decoration>> *)
                std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->idToQCOMDecorations,&local_14);
      __position._M_current = *(Decoration **)(this_00 + 8);
      if (__position._M_current == *(Decoration **)(this_00 + 0x10)) {
        std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
        _M_realloc_insert<spv::Decoration_const&>(this_00,__position,&local_18);
      }
      else {
        *__position._M_current = local_18;
        *(Decoration **)(this_00 + 8) = __position._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessingQCOMDecoration(spv::Id id, spv::Decoration decor)
{
  spv::Op opc = builder.getOpCode(id);
  if (opc == spv::OpSampledImage) {
    id  = builder.getIdOperand(id, 0);
    opc = builder.getOpCode(id);
  }

  if (opc == spv::OpLoad) {
    spv::Id texid = builder.getIdOperand(id, 0);
    if (!hasQCOMImageProceessingDecoration(texid, decor)) {//
      builder.addDecoration(texid, decor);
      idToQCOMDecorations[texid].push_back(decor);
    }
  }
}